

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredRenderCase::iterate(LayeredRenderCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestLog *pTVar2;
  bool bVar3;
  bool bVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  undefined4 extraout_var_02;
  ObjectTraits *traits;
  long *plVar7;
  Surface *pSVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  void *__buf;
  void *__buf_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  char *description;
  int iVar11;
  IterateResult IVar12;
  undefined8 uVar13;
  TestContext *this_00;
  uint layer_00;
  undefined4 uVar14;
  string *psVar15;
  string *barColor;
  float rowWidthRatio;
  ulong uVar16;
  Surface layer_1;
  ScopedLogSection section_1;
  ScopedLogSection section;
  Vec4 colors [6];
  Surface layer1;
  Surface layer0;
  Surface layer;
  string local_388;
  LogImageSet local_360;
  string local_320;
  ScopedLogSection local_300;
  LogImage local_2f8;
  Surface local_260;
  Surface local_248;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [8];
  float local_1a8;
  float local_1a4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_140 [8];
  ios_base local_138 [264];
  undefined4 extraout_var_01;
  
  psVar15 = &local_388;
  barColor = &local_388;
  iVar11 = this->m_iteration;
  this->m_iteration = iVar11 + 1;
  if (iVar11 == 0) {
    if (this->m_test != TEST_LAYER_PROVOKING_VERTEX) {
LAB_013e8448:
      pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_1b0 = (undefined1  [8])&local_1a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"RenderToTexture","");
      paVar9 = &local_2f8.m_name.field_2;
      local_2f8.m_name._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2f8,"Render to layered texture","");
      tcu::ScopedLogSection::ScopedLogSection
                ((ScopedLogSection *)&local_360,pTVar2,(string *)local_1b0,&local_2f8.m_name);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8.m_name._M_dataplus._M_p != paVar9) {
        operator_delete(local_2f8.m_name._M_dataplus._M_p,
                        local_2f8.m_name.field_2._M_allocated_capacity + 1);
      }
      if (local_1b0 != (undefined1  [8])&local_1a0) {
        operator_delete((void *)local_1b0,local_1a0._M_allocated_capacity + 1);
      }
      uVar13 = 0;
      uVar14 = 0;
      if ((ulong)this->m_target < 5) {
        uVar14 = *(undefined4 *)(&DAT_01c3a2c0 + (ulong)this->m_target * 4);
        uVar13 = 0x40;
      }
      iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      lVar6 = CONCAT44(extraout_var_01,iVar11);
      iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      traits = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
      glu::ObjectWrapper::ObjectWrapper
                ((ObjectWrapper *)&local_2f8,(Functions *)CONCAT44(extraout_var_02,iVar11),traits);
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"Rendering to texture",0x14);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      (**(code **)(lVar6 + 0x78))(0x8d40,this->m_fbo);
      (**(code **)(lVar6 + 0x1c0))(0);
      (**(code **)(lVar6 + 0x188))(0x4000);
      (**(code **)(lVar6 + 0x1a00))(0,0,uVar13,uVar14);
      (**(code **)(lVar6 + 0x188))(0x4000);
      (**(code **)(lVar6 + 0xd8))(local_2f8.m_name.field_2._M_allocated_capacity & 0xffffffff);
      (**(code **)(lVar6 + 0x1680))((this->m_renderShader->m_program).m_program);
      (**(code **)(lVar6 + 0x538))(0,0,1);
      (**(code **)(lVar6 + 0x1680))(0);
      (**(code **)(lVar6 + 0xd8))(0);
      (**(code **)(lVar6 + 0x78))(0x8d40,0);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"render",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                      ,0xd35);
      glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)&local_2f8);
      tcu::TestLog::endSection((TestLog *)local_360.m_name._M_dataplus._M_p);
      return CONTINUE;
    }
    local_360.m_name._M_dataplus._M_p = (pointer)0xdededededededede;
    local_360.m_name._M_string_length = CONCAT44(local_360.m_name._M_string_length._4_4_,0xdededede)
    ;
    iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar11) + 0x868))
              (0x825e,(undefined1 *)((long)&local_360.m_name._M_dataplus._M_p + 4));
    iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    dVar5 = (**(code **)(CONCAT44(extraout_var_00,iVar11) + 0x800))();
    glu::checkError(dVar5,"getInteger(GL_LAYER_PROVOKING_VERTEX)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                    ,0xb11);
    bVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                      ((StateQueryMemoryWriteGuard<int> *)&local_360,
                       (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    if (bVar3) {
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"GL_LAYER_PROVOKING_VERTEX = ",0x1c);
      local_2f8.m_name._M_dataplus._M_p = (pointer)glu::getProvokingVertexName;
      local_2f8.m_name._M_string_length =
           CONCAT44(local_2f8.m_name._M_string_length._4_4_,local_360.m_name._M_dataplus._M_p._4_4_)
      ;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_2f8,(ostream *)&local_1a8);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      if ((local_360.m_name._M_dataplus._M_p._4_4_ - 0x8e4d < 2) ||
         (local_360.m_name._M_dataplus._M_p._4_4_ == 0x8260)) {
        this->m_provokingVertex = local_360.m_name._M_dataplus._M_p._4_4_;
        goto LAB_013e8448;
      }
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,
                 "getInteger(GL_LAYER_PROVOKING_VERTEX) returned illegal value. Got ",0x42);
      std::ostream::operator<<((ostringstream *)&local_1a8,local_360.m_name._M_dataplus._M_p._4_4_);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "got unexpected provoking vertex value";
      goto LAB_013e8d38;
    }
    goto LAB_013e8d42;
  }
  if ((this->m_test == TEST_LAYER_PROVOKING_VERTEX) && (this->m_provokingVertex == 0x8260)) {
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_1b0 = (undefined1  [8])&local_1a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"VerifyLayers","");
    local_2f8.m_name._M_dataplus._M_p = (pointer)&local_2f8.m_name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Verify layers 0 and 1","")
    ;
    tcu::ScopedLogSection::ScopedLogSection(&local_300,pTVar2,(string *)local_1b0,&local_2f8.m_name)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.m_name._M_dataplus._M_p != &local_2f8.m_name.field_2) {
      operator_delete(local_2f8.m_name._M_dataplus._M_p,
                      local_2f8.m_name.field_2._M_allocated_capacity + 1);
    }
    if (local_1b0 != (undefined1  [8])&local_1a0) {
      operator_delete((void *)local_1b0,local_1a0._M_allocated_capacity + 1);
    }
    tcu::Surface::Surface
              (&local_248,(this->m_resolveDimensions).m_data[0],
               (this->m_resolveDimensions).m_data[1]);
    tcu::Surface::Surface
              (&local_260,(this->m_resolveDimensions).m_data[0],
               (this->m_resolveDimensions).m_data[1]);
    sampleTextureLayer(this,&local_248,0);
    sampleTextureLayer(this,&local_260,1);
    bVar3 = verifyEmptyImage(this,&local_248,false);
    bVar4 = verifyEmptyImage(this,&local_260,false);
    local_1b0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Expecting non-empty layers, or non-empty layer.",0x2f);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    if (bVar3 && bVar4) {
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"Got empty images.",0x11);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
    local_388.field_2._M_allocated_capacity = 0x6e6f43726579614c;
    local_388.field_2._8_4_ = 0x746e6574;
    local_388._M_string_length = 0xc;
    local_388.field_2._M_local_buf[0xc] = '\0';
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    local_320.field_2._M_allocated_capacity._0_5_ = 0x726579614c;
    local_320.field_2._M_allocated_capacity._5_3_ = 0x6f6320;
    local_320.field_2._8_5_ = 0x746e65746e;
    local_320._M_string_length = 0xd;
    local_320.field_2._M_local_buf[0xd] = '\0';
    tcu::LogImageSet::LogImageSet(&local_360,&local_388,&local_320);
    tcu::TestLog::startImageSet
              (pTVar2,local_360.m_name._M_dataplus._M_p,local_360.m_description._M_dataplus._M_p);
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    local_230.field_2._M_allocated_capacity._0_4_ = 0x6579614c;
    local_230.field_2._M_allocated_capacity._4_2_ = 0x72;
    local_230._M_string_length = 5;
    local_1d0.field_2._M_allocated_capacity._0_4_ = 0x6579614c;
    local_1d0.field_2._M_allocated_capacity._4_2_ = 0x3072;
    local_1d0._M_string_length = 6;
    local_1d0.field_2._M_local_buf[6] = '\0';
    pSVar8 = &local_248;
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b0,&local_230,&local_1d0,pSVar8,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b0,(int)pTVar2,__buf,(size_t)pSVar8);
    local_1f0.field_2._M_allocated_capacity._0_4_ = 0x6579614c;
    local_1f0.field_2._M_allocated_capacity._4_2_ = 0x72;
    local_1f0._M_string_length = 5;
    local_210.field_2._M_allocated_capacity._0_4_ = 0x6579614c;
    local_210.field_2._M_allocated_capacity._4_2_ = 0x3172;
    local_210._M_string_length = 6;
    local_210.field_2._M_local_buf[6] = '\0';
    pSVar8 = &local_260;
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    tcu::LogImage::LogImage(&local_2f8,&local_1f0,&local_210,pSVar8,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_2f8,(int)pTVar2,__buf_00,(size_t)pSVar8);
    tcu::TestLog::endImageSet(pTVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.m_description._M_dataplus._M_p != &local_2f8.m_description.field_2) {
      operator_delete(local_2f8.m_description._M_dataplus._M_p,
                      local_2f8.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.m_name._M_dataplus._M_p != &local_2f8.m_name.field_2) {
      operator_delete(local_2f8.m_name._M_dataplus._M_p,
                      local_2f8.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,
                      CONCAT17(local_210.field_2._M_local_buf[7],
                               CONCAT16(local_210.field_2._M_local_buf[6],
                                        CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                 local_210.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,
                      CONCAT26(local_1f0.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_1f0.field_2._M_allocated_capacity._4_2_,
                                        local_1f0.field_2._M_allocated_capacity._0_4_)) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if (local_1b0 != (undefined1  [8])&local_1a0) {
      operator_delete((void *)local_1b0,local_1a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,
                      CONCAT17(local_1d0.field_2._M_local_buf[7],
                               CONCAT16(local_1d0.field_2._M_local_buf[6],
                                        CONCAT24(local_1d0.field_2._M_allocated_capacity._4_2_,
                                                 local_1d0.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,
                      CONCAT26(local_230.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_230.field_2._M_allocated_capacity._4_2_,
                                        local_230.field_2._M_allocated_capacity._0_4_)) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360.m_description._M_dataplus._M_p != &local_360.m_description.field_2) {
      operator_delete(local_360.m_description._M_dataplus._M_p,
                      local_360.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360.m_name._M_dataplus._M_p != &local_360.m_name.field_2) {
      operator_delete(local_360.m_name._M_dataplus._M_p,
                      local_360.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,
                      CONCAT35(local_320.field_2._M_allocated_capacity._5_3_,
                               local_320.field_2._M_allocated_capacity._0_5_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if (bVar3 && bVar4) {
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"Image verification failed.",0x1a);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"Image is valid.",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    this->m_allLayersOk = (bool)(this->m_allLayersOk & (!bVar3 || !bVar4));
    tcu::Surface::~Surface(&local_260);
    tcu::Surface::~Surface(&local_248);
    tcu::TestLog::endSection(local_300.m_log);
    if (2 < this->m_numLayers) {
      iVar11 = 2;
      do {
        pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        local_2f8.m_name._M_dataplus._M_p = (pointer)&local_2f8.m_name.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"VerifyLayer","");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::ostream::operator<<((Surface *)local_1b0,iVar11);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
        std::ios_base::~ios_base(local_140);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_388,0,(char *)0x0,0x1c40bb3);
        local_360.m_name._M_dataplus._M_p = (pointer)&local_360.m_name.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 == paVar9) {
          local_360.m_name.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_360.m_name.field_2._8_8_ = plVar7[3];
        }
        else {
          local_360.m_name.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_360.m_name._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_360.m_name._M_string_length = plVar7[1];
        *plVar7 = (long)paVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        tcu::ScopedLogSection::ScopedLogSection
                  ((ScopedLogSection *)&local_320,pTVar2,&local_2f8.m_name,&local_360.m_name);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360.m_name._M_dataplus._M_p != &local_360.m_name.field_2) {
          operator_delete(local_360.m_name._M_dataplus._M_p,
                          local_360.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_dataplus._M_p != &local_388.field_2) {
          operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8.m_name._M_dataplus._M_p != &local_2f8.m_name.field_2) {
          operator_delete(local_2f8.m_name._M_dataplus._M_p,
                          local_2f8.m_name.field_2._M_allocated_capacity + 1);
        }
        tcu::Surface::Surface
                  ((Surface *)local_1b0,(this->m_resolveDimensions).m_data[0],
                   (this->m_resolveDimensions).m_data[1]);
        sampleTextureLayer(this,(Surface *)local_1b0,iVar11);
        bVar3 = verifyEmptyImage(this,(Surface *)local_1b0,true);
        this->m_allLayersOk = (bool)(this->m_allLayersOk & bVar3);
        tcu::Surface::~Surface((Surface *)local_1b0);
        tcu::TestLog::endSection((TestLog *)local_320._M_dataplus._M_p);
        iVar11 = iVar11 + 1;
      } while (iVar11 < this->m_numLayers);
    }
    goto LAB_013e8d12;
  }
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  paVar1 = &local_2f8.m_name.field_2;
  local_2f8.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"VerifyLayer","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  layer_00 = iVar11 - 1;
  std::ostream::operator<<(local_1b0,layer_00);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_388,0,(char *)0x0,0x1c40bb3);
  paVar9 = &local_360.m_name.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 == paVar10) {
    local_360.m_name.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_360.m_name.field_2._8_8_ = plVar7[3];
    local_360.m_name._M_dataplus._M_p = (pointer)paVar9;
  }
  else {
    local_360.m_name.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_360.m_name._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_360.m_name._M_string_length = plVar7[1];
  *plVar7 = (long)paVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_320,pTVar2,&local_2f8.m_name,&local_360.m_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.m_name._M_dataplus._M_p != paVar9) {
    operator_delete(local_360.m_name._M_dataplus._M_p,
                    local_360.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8.m_name._M_dataplus._M_p,
                    local_2f8.m_name.field_2._M_allocated_capacity + 1);
  }
  tcu::Surface::Surface
            ((Surface *)&local_360,(this->m_resolveDimensions).m_data[0],
             (this->m_resolveDimensions).m_data[1]);
  sampleTextureLayer(this,(Surface *)&local_360,layer_00);
  local_388._M_dataplus._M_p = (pointer)0x3f8000003f800000;
  local_388._M_string_length = 0x3f8000003f800000;
  local_2f8.m_name._M_dataplus._M_p = (pointer)0x3f8000003f800000;
  local_2f8.m_name._M_string_length = 0x3f8000003f800000;
  local_2f8.m_name.field_2._M_allocated_capacity = 0x3f800000;
  local_2f8.m_name.field_2._8_8_ = 0x3f80000000000000;
  local_2f8.m_description._M_dataplus._M_p = (pointer)0x3f80000000000000;
  local_2f8.m_description._M_string_length = 0x3f80000000000000;
  local_2f8.m_description.field_2._M_allocated_capacity = 0;
  local_2f8.m_description.field_2._8_8_ = 0x3f8000003f800000;
  local_2f8.m_access.m_format.order = 0x3f800000;
  local_2f8.m_access.m_format.type = 0x3f800000;
  local_2f8.m_access.m_size.m_data[0] = 0;
  local_2f8.m_access.m_size.m_data[1] = 0x3f800000;
  local_2f8.m_access.m_size.m_data[2] = 0x3f800000;
  local_2f8.m_access.m_pitch.m_data[0] = 0;
  local_2f8.m_access.m_pitch.m_data[1] = 0x3f800000;
  local_2f8.m_access.m_pitch.m_data[2] = 0x3f800000;
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Verifying layer contents",0x18);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  switch(this->m_test) {
  case TEST_DEFAULT_LAYER:
switchD_013e8b3c_caseD_0:
    if (layer_00 == 0) goto LAB_013e8b50;
LAB_013e8cd2:
    bVar3 = verifyEmptyImage(this,(Surface *)&local_360,true);
    break;
  case TEST_SINGLE_LAYER:
    psVar15 = &local_388;
    if (this->m_targetLayer != layer_00) goto LAB_013e8cd2;
    goto LAB_013e8b50;
  case TEST_ALL_LAYERS:
  case TEST_INVOCATION_PER_LAYER:
    psVar15 = (string *)((long)&local_2f8.m_access.m_size + (long)(int)layer_00 * 0x10 + -0x48);
    goto LAB_013e8b50;
  case TEST_DIFFERENT_LAYERS:
  case TEST_MULTIPLE_LAYERS_PER_INVOCATION:
    if (layer_00 == 0) goto LAB_013e8cd2;
    rowWidthRatio = (float)(int)layer_00 / (float)this->m_numLayers;
    goto LAB_013e8b77;
  case TEST_LAYER_ID:
    if (layer_00 == 0) {
      local_1a8 = 1.0;
    }
    else {
      local_1a8 = 0.0;
    }
    uVar16 = CONCAT44(-(uint)(((int)layer_00 / 2 & 0x80000001U) == 1),
                      -(uint)((layer_00 & 0x80000001) == 1));
    local_1b0 = (undefined1  [8])(uVar16 & DAT_01a25cf0 | ~uVar16 & DAT_01a35580);
    local_1a4 = 1.0;
    bVar3 = verifyImageSingleColoredRow(this,(Surface *)&local_360,0.5,(Vec4 *)local_1b0,true);
    break;
  case TEST_LAYER_PROVOKING_VERTEX:
    if (this->m_provokingVertex != 0x8e4e) {
      if (this->m_provokingVertex != 0x8e4d) goto switchD_013e8b3c_default;
      goto switchD_013e8b3c_caseD_0;
    }
    psVar15 = &local_388;
    if (layer_00 != 1) goto LAB_013e8cd2;
LAB_013e8b50:
    rowWidthRatio = 0.5;
    barColor = psVar15;
LAB_013e8b77:
    bVar3 = verifyImageSingleColoredRow
                      (this,(Surface *)&local_360,rowWidthRatio,(Vec4 *)barColor,true);
    break;
  default:
switchD_013e8b3c_default:
    bVar3 = false;
  }
  this->m_allLayersOk = (bool)(this->m_allLayersOk & bVar3);
  iVar11 = this->m_numLayers;
  tcu::Surface::~Surface((Surface *)&local_360);
  tcu::TestLog::endSection((TestLog *)local_320._M_dataplus._M_p);
  IVar12 = CONTINUE;
  if (iVar11 + -1 <= (int)layer_00) {
LAB_013e8d12:
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (this->m_allLayersOk == true) {
      IVar12 = STOP;
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,"Pass");
    }
    else {
      description = "Detected invalid layer content";
LAB_013e8d38:
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,description);
LAB_013e8d42:
      IVar12 = STOP;
    }
  }
  return IVar12;
}

Assistant:

LayeredRenderCase::IterateResult LayeredRenderCase::iterate (void)
{
	++m_iteration;

	if (m_iteration == 1)
	{
		if (m_test == TEST_LAYER_PROVOKING_VERTEX)
		{
			// which layer the implementation claims to render to

			gls::StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLint> state;

			m_context.getRenderContext().getFunctions().getIntegerv(GL_LAYER_PROVOKING_VERTEX, &state);
			GLU_EXPECT_NO_ERROR(m_context.getRenderContext().getFunctions().getError(), "getInteger(GL_LAYER_PROVOKING_VERTEX)");

			if (!state.verifyValidity(m_testCtx))
				return STOP;

			m_testCtx.getLog() << tcu::TestLog::Message << "GL_LAYER_PROVOKING_VERTEX = " << glu::getProvokingVertexStr(state) << tcu::TestLog::EndMessage;

			if (state != GL_FIRST_VERTEX_CONVENTION &&
				state != GL_LAST_VERTEX_CONVENTION &&
				state != GL_UNDEFINED_VERTEX)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "getInteger(GL_LAYER_PROVOKING_VERTEX) returned illegal value. Got " << state << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected provoking vertex value");
				return STOP;
			}

			m_provokingVertex = (glw::GLenum)state;
		}

		// render to texture
		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "RenderToTexture", "Render to layered texture");

			// render to layered texture with the geometry shader
			renderToTexture();
		}

		return CONTINUE;
	}
	else if (m_test == TEST_LAYER_PROVOKING_VERTEX && m_provokingVertex == GL_UNDEFINED_VERTEX)
	{
		// Verification requires information from another layers, layers not independent
		{
			const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "VerifyLayers", "Verify layers 0 and 1");
			tcu::Surface				layer0		(m_resolveDimensions.x(), m_resolveDimensions.y());
			tcu::Surface				layer1		(m_resolveDimensions.x(), m_resolveDimensions.y());

			// sample layer to frame buffer
			sampleTextureLayer(layer0, 0);
			sampleTextureLayer(layer1, 1);

			m_allLayersOk &= verifyProvokingVertexLayers(layer0, layer1);
		}

		// Other layers empty
		for (int layerNdx = 2; layerNdx < m_numLayers; ++layerNdx)
		{
			const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "VerifyLayer", "Verify layer " + de::toString(layerNdx));
			tcu::Surface				layer		(m_resolveDimensions.x(), m_resolveDimensions.y());

			// sample layer to frame buffer
			sampleTextureLayer(layer, layerNdx);

			// verify
			m_allLayersOk &= verifyEmptyImage(layer);
		}
	}
	else
	{
		// Layers independent

		const int					layerNdx	= m_iteration - 2;
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "VerifyLayer", "Verify layer " + de::toString(layerNdx));
		tcu::Surface				layer		(m_resolveDimensions.x(), m_resolveDimensions.y());

		// sample layer to frame buffer
		sampleTextureLayer(layer, layerNdx);

		// verify
		m_allLayersOk &= verifyLayerContent(layer, layerNdx);

		if (layerNdx < m_numLayers-1)
			return CONTINUE;
	}

	// last iteration
	if (m_allLayersOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Detected invalid layer content");

	return STOP;
}